

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch_set.c
# Opt level: O0

int mpt_dispatch_set(mpt_dispatch *disp,uintptr_t id,mpt_event_handler_t cmd,void *arg)

{
  mpt_command *pmVar1;
  int pos;
  mpt_command *dst;
  void *arg_local;
  mpt_event_handler_t cmd_local;
  uintptr_t id_local;
  mpt_dispatch *disp_local;
  
  pmVar1 = mpt_command_get(&disp->_d,id);
  if (cmd == (mpt_event_handler_t)0x0) {
    if (pmVar1 == (mpt_command *)0x0) {
      disp_local._4_4_ = -1;
    }
    else {
      disp_local._4_4_ = (int)(((long)pmVar1 - (long)((disp->_d)._buf + 1)) / 0x18);
      (*pmVar1->cmd)(pmVar1->arg,(void *)0x0);
      pmVar1->cmd = (_func_int_void_ptr_void_ptr *)0x0;
      pmVar1->arg = (void *)0x0;
    }
  }
  else if (pmVar1 == (mpt_command *)0x0) {
    disp_local._4_4_ = mpt_command_set(&disp->_d,id,(_func_int_void_ptr_void_ptr *)cmd,arg);
  }
  else {
    disp_local._4_4_ = -1;
  }
  return disp_local._4_4_;
}

Assistant:

extern int mpt_dispatch_set(MPT_STRUCT(dispatch) *disp, uintptr_t id, MPT_TYPE(event_handler) cmd, void *arg)
{
	MPT_STRUCT(command) *dst = mpt_command_get(&disp->_d, id);
	
	/* clear registration */
	if (!cmd) {
		int pos;
		if (!dst) {
			return MPT_ERROR(BadArgument);
		}
		pos = dst - ((MPT_STRUCT(command) *) (disp->_d._buf + 1));
		dst->cmd(dst->arg, 0);
		dst->cmd = 0;
		dst->arg = 0;
		return pos;
	}
	/* id already used */
	if (dst) {
		return MPT_ERROR(BadArgument);
	}
	/* register command */
	return mpt_command_set(&disp->_d, id, (int (*)()) cmd, arg);
}